

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
* __thiscall
Jinx::Impl::Script::WalkSubscripts
          (pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
           *__return_storage_ptr__,Script *this,uint32_t subscripts,CollectionPtr *collection)

{
  bool bVar1;
  size_type sVar2;
  reference copy;
  element_type *peVar3;
  map<Jinx::Variant,Jinx::Variant,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
  *this_00;
  pointer ppVar4;
  __enable_if_t<is_constructible<value_type,_pair<Variant,_Variant>_>::value,_pair<iterator,_bool>_>
  _Var5;
  Variant local_168;
  uint local_13c;
  undefined1 local_138 [4];
  uint32_t i_1;
  undefined1 local_128 [112];
  CollectionPtr local_b8;
  undefined1 local_a8 [8];
  Variant newColl;
  _Self local_78;
  iterator itr;
  size_t index;
  undefined1 local_50 [4];
  uint32_t i;
  Variant key;
  CollectionPtr *collection_local;
  uint32_t subscripts_local;
  Script *this_local;
  
  key.field_1._24_8_ = collection;
  Jinx::Variant::Variant((Variant *)local_50);
  index._4_4_ = 0;
  do {
    if (subscripts <= index._4_4_) {
      for (local_13c = 0; local_13c < subscripts; local_13c = local_13c + 1) {
        Pop(&local_168,this);
        Jinx::Variant::~Variant(&local_168);
      }
      std::
      make_pair<std::shared_ptr<std::map<Jinx::Variant,Jinx::Variant,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>>&,Jinx::Variant&>
                (__return_storage_ptr__,collection,(Variant *)local_50);
LAB_001fb4f5:
      itr._M_node._0_4_ = 1;
      Jinx::Variant::~Variant((Variant *)local_50);
      return __return_storage_ptr__;
    }
    sVar2 = std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::size
                      (&this->m_stack);
    copy = std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::
           operator[](&this->m_stack,sVar2 - (subscripts - index._4_4_));
    Jinx::Variant::operator=((Variant *)local_50,copy);
    bVar1 = Jinx::Variant::IsKeyType((Variant *)local_50);
    if (!bVar1) {
      Error(this,"Invalid key type");
      std::
      pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
      ::
      pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant,_true>
                (__return_storage_ptr__);
      goto LAB_001fb4f5;
    }
    if (index._4_4_ < subscripts - 1) {
      peVar3 = std::
               __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)collection);
      local_78._M_node =
           (_Base_ptr)
           std::
           map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
           ::find(peVar3,(key_type *)local_50);
      peVar3 = std::
               __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)collection);
      newColl.field_1._24_8_ =
           std::
           map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
           ::end(peVar3);
      bVar1 = std::operator==(&local_78,(_Self *)((long)&newColl.field_1 + 0x18));
      if (bVar1) {
        CreateCollection();
        Jinx::Variant::Variant((Variant *)local_a8,&local_b8);
        std::
        shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
        ::~shared_ptr(&local_b8);
        this_00 = (map<Jinx::Variant,Jinx::Variant,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
                   *)std::
                     __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)collection);
        std::make_pair<Jinx::Variant&,Jinx::Variant&>
                  ((pair<Jinx::Variant,_Jinx::Variant> *)(local_128 + 0x20),(Variant *)local_50,
                   (Variant *)local_a8);
        _Var5 = std::
                map<Jinx::Variant,Jinx::Variant,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
                ::insert<std::pair<Jinx::Variant,Jinx::Variant>>
                          (this_00,(pair<Jinx::Variant,_Jinx::Variant> *)(local_128 + 0x20));
        local_128._16_8_ = _Var5.first._M_node;
        local_128[0x18] = _Var5.second;
        std::pair<Jinx::Variant,_Jinx::Variant>::~pair
                  ((pair<Jinx::Variant,_Jinx::Variant> *)(local_128 + 0x20));
        Jinx::Variant::GetCollection((Variant *)local_128);
        std::
        shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
        ::operator=(collection,
                    (shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                     *)local_128);
        std::
        shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
        ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                       *)local_128);
        Jinx::Variant::~Variant((Variant *)local_a8);
      }
      else {
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator->
                           (&local_78);
        bVar1 = Jinx::Variant::IsCollection(&ppVar4->second);
        if (!bVar1) {
          Error(this,"Expected collection when accessing by key");
          std::
          pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
          ::
          pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant,_true>
                    (__return_storage_ptr__);
          goto LAB_001fb4f5;
        }
        std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator->
                  (&local_78);
        Jinx::Variant::GetCollection((Variant *)local_138);
        std::
        shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
        ::operator=(collection,
                    (shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                     *)local_138);
        std::
        shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
        ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                       *)local_138);
      }
    }
    index._4_4_ = index._4_4_ + 1;
  } while( true );
}

Assistant:

inline std::pair<CollectionPtr, Variant> Script::WalkSubscripts(uint32_t subscripts, CollectionPtr collection)
	{
		// Walk up through subsequent subscript operators, then pops the keys off the stack and 
		// returns the final collection and key pair,
		Variant key;

		// Loop through the number of subscript operations used
		for (uint32_t i = 0; i < subscripts; ++i)
		{
			// Grab the appropriate key in the stack for this subscript 
			size_t index = m_stack.size() - (subscripts - i);
			key = m_stack[index];
			if (!key.IsKeyType())
			{
				Error("Invalid key type");
				return {};
			}

			// We only need to retrieve a new collection and key set if
			// this isn't the last operation.
			if (i < (subscripts - 1))
			{
				auto itr = collection->find(key);
				if (itr == collection->end())
				{
					Variant newColl = CreateCollection();
					collection->insert(std::make_pair(key, newColl));
					collection = newColl.GetCollection();
				}
				else if (itr->second.IsCollection())
				{
					collection = itr->second.GetCollection();
				}
				else
				{
					Error("Expected collection when accessing by key");
					return {};
				}
			}
		}

		// Pop keys off the stack
		for (uint32_t i = 0; i < subscripts; ++i)
			Pop();

		// Return the final collection and key pair
		return std::make_pair(collection, key);
	}